

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O2

int leveldb::VarintLength(uint64_t v)

{
  int len;
  int iVar1;
  
  iVar1 = 1;
  for (; 0x7f < v; v = v >> 7) {
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int VarintLength(uint64_t v) {
  int len = 1;
  while (v >= 128) {
    v >>= 7;
    len++;
  }
  return len;
}